

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  size_t in_RCX;
  uchar *sig;
  uchar *in_R8;
  size_t in_R9;
  string local_128 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_108;
  undefined1 local_f0 [8];
  tree ntree;
  int local_8c;
  string local_88 [8];
  string str;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  allocator local_39;
  string local_38 [8];
  string check_str;
  char **argv_local;
  int argc_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter Merkle Leafes: ");
  std::operator<<(poVar3,'\n');
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68);
  do {
    std::__cxx11::string::string(local_88);
    std::operator>>((istream *)&std::cin,local_88);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,";");
    if (bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,(value_type *)local_88);
      local_8c = 0;
    }
    else {
      local_8c = 3;
    }
    std::__cxx11::string::~string(local_88);
  } while (local_8c == 0);
  poVar3 = std::operator<<((ostream *)&std::cout,"Enter Leaf to verify: ");
  std::operator<<(poVar3,'\n');
  std::operator>>((istream *)&std::cin,local_38);
  picosha2::hash256_hex_string<std::__cxx11::string>
            ((picosha2 *)
             &ntree.base.
              super__Vector_base<std::vector<node_*,_std::allocator<node_*>_>,_std::allocator<std::vector<node_*,_std::allocator<node_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  this = &ntree.base.
          super__Vector_base<std::vector<node_*,_std::allocator<node_*>_>,_std::allocator<std::vector<node_*,_std::allocator<node_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::operator=(local_38,(string *)this);
  std::__cxx11::string::~string((string *)this);
  tree::tree((tree *)local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_108,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68);
  tree::buildBaseLeafes((tree *)local_f0,&local_108);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_108);
  tree::buildTree((tree *)local_f0);
  poVar3 = std::operator<<((ostream *)&std::cout,"Check if: ");
  poVar3 = std::operator<<(poVar3,local_38);
  poVar3 = std::operator<<(poVar3," is contained in tree");
  std::operator<<(poVar3,'\n');
  std::__cxx11::string::string(local_128,local_38);
  iVar2 = tree::verify((tree *)local_f0,(EVP_PKEY_CTX *)local_128,sig,in_RCX,in_R8,in_R9);
  std::__cxx11::string::~string(local_128);
  if (iVar2 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Nope something is wrong");
    std::operator<<(poVar3,'\n');
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"All Clear");
    std::operator<<(poVar3,'\n');
  }
  tree::~tree((tree *)local_f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  std::__cxx11::string::~string(local_38);
  return 0;
}

Assistant:

int main(int argc, char const *argv[]) {


  string check_str = "";

  std::cout << "Enter Merkle Leafes: " << '\n';
  std::vector<string> v;

  while(1) {
    string str;
    std::cin >> str;
    if(str != ";")
      v.push_back(str);
    else
      break;
  }

  std::cout << "Enter Leaf to verify: " << '\n';

  cin >> check_str;

  check_str = picosha2::hash256_hex_string(check_str);


  tree ntree;

  ntree.buildBaseLeafes(v);
  ntree.buildTree();

  std::cout << "Check if: " << check_str << " is contained in tree" << '\n';

  if(ntree.verify(check_str)){
    std::cout << "All Clear" << '\n';
  } else {
      std::cout << "Nope something is wrong" << '\n';
  }



  return 0;
}